

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

ssize_t __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::OutgoingRpcMessageImpl::send
          (OutgoingRpcMessageImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  TestVat *pTVar1;
  Reader params;
  bool bVar2;
  ulong uVar3;
  undefined7 extraout_var_00;
  Function<bool_(capnp::rpc::Message::Reader)> *this_00;
  TaskSet *this_01;
  Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl,_std::nullptr_t>
  *other;
  ulong extraout_RAX;
  ConnectionImpl *local_110;
  Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl,_std::nullptr_t>
  local_108;
  Promise<void> local_f8;
  ConnectionImpl *local_f0;
  ConnectionImpl *connectionPtr;
  Builder local_e0;
  Reader local_b8;
  Function<bool_(capnp::rpc::Message::Reader)> *local_88;
  Function<bool_(capnp::rpc::Message::Reader)> *p;
  Function<bool_(capnp::rpc::Message::Reader)> *_p392;
  ForkedPromise<void> local_70;
  ForkedPromise<void> *b;
  ForkedPromise<void> *_b386;
  Promise<void> blocker;
  Array<capnp::word> local_40;
  undefined1 local_28 [8];
  Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl,_std::nullptr_t>
  incomingMessage;
  bool _kj_shouldLog;
  DebugExpression<bool> _kjCondition;
  OutgoingRpcMessageImpl *this_local;
  undefined7 extraout_var;
  
  incomingMessage.ptr._6_1_ = (this->connection->idle ^ 0xffU) & 1;
  incomingMessage.ptr._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                  (bool *)((long)&incomingMessage.ptr + 6));
  bVar2 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)((long)&incomingMessage.ptr + 7));
  if (!bVar2) {
    incomingMessage.ptr._5_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)incomingMessage.ptr._5_1_ != false) {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x173,ERROR,"\"failed: expected \" \"!connection.idle\", _kjCondition",
                 (char (*) [34])"failed: expected !connection.idle",
                 (DebugExpression<bool> *)((long)&incomingMessage.ptr + 7));
      incomingMessage.ptr._5_1_ = false;
    }
  }
  bVar2 = kj::Function<bool_(capnp::MessageBuilder_&)>::operator()
                    (&this->connection->vat->sendCallback,&(this->message).super_MessageBuilder);
  uVar3 = CONCAT71(extraout_var,bVar2);
  if (bVar2) {
    bVar2 = kj::Maybe<kj::Exception>::operator==(&this->connection->networkException);
    uVar3 = CONCAT71(extraout_var_00,bVar2) ^ 0xff;
    if ((uVar3 & 1) == 0) {
      pTVar1 = this->connection->vat;
      pTVar1->sent = pTVar1->sent + 1;
      messageToFlatArray(&local_40,&(this->message).super_MessageBuilder);
      kj::
      heap<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl,kj::Array<capnp::word>>
                ((kj *)local_28,&local_40);
      kj::Array<capnp::word>::~Array(&local_40);
      kj::Promise<void>::Promise((Promise<void> *)&_b386,(void *)0x0);
      b = kj::_::readMaybe<kj::ForkedPromise<void>>(&this->connection->currentBlock);
      if ((ForkHub<kj::_::Void> *)b == (ForkHub<kj::_::Void> *)0x0) {
        kj::yield();
        kj::Promise<void>::operator=((Promise<void> *)&_b386,(Promise<void> *)&_p392);
        kj::Promise<void>::~Promise((Promise<void> *)&_p392);
        this_00 = kj::_::readMaybe<kj::Function<bool(capnp::rpc::Message::Reader)>>
                            (&this->connection->blockAfterPredicate);
        p = this_00;
        if (this_00 != (Function<bool_(capnp::rpc::Message::Reader)> *)0x0) {
          local_88 = this_00;
          MessageBuilder::getRoot<capnp::rpc::Message>
                    (&local_e0,&(this->message).super_MessageBuilder);
          rpc::Message::Builder::operator_cast_to_Reader(&local_b8,&local_e0);
          params._reader.capTable = local_b8._reader.capTable;
          params._reader.segment = local_b8._reader.segment;
          params._reader.data = local_b8._reader.data;
          params._reader.pointers = local_b8._reader.pointers;
          params._reader.dataSize = local_b8._reader.dataSize;
          params._reader.pointerCount = local_b8._reader.pointerCount;
          params._reader._38_2_ = local_b8._reader._38_2_;
          params._reader.nestingLimit = local_b8._reader.nestingLimit;
          params._reader._44_4_ = local_b8._reader._44_4_;
          bVar2 = kj::Function<bool_(capnp::rpc::Message::Reader)>::operator()(this_00,params);
          if (bVar2) {
            block(this->connection);
            kj::Maybe<kj::Function<bool_(capnp::rpc::Message::Reader)>_>::operator=
                      (&this->connection->blockAfterPredicate);
          }
        }
      }
      else {
        local_70.hub.ptr = (ForkHub<kj::_::Void> *)b;
        kj::ForkedPromise<void>::addBranch(&local_70);
        kj::Promise<void>::operator=((Promise<void> *)&_b386,(Promise<void> *)&local_70);
        kj::Promise<void>::~Promise((Promise<void> *)&local_70);
      }
      local_f0 = this->connection;
      this_01 = kj::Own<kj::TaskSet,_std::nullptr_t>::operator->(&this->connection->tasks);
      local_110 = local_f0;
      other = kj::
              mv<kj::Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl,decltype(nullptr)>>
                        ((Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl,_std::nullptr_t>
                          *)local_28);
      kj::
      Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl,_std::nullptr_t>
      ::Own(&local_108,other);
      kj::Promise<void>::
      then<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::OutgoingRpcMessageImpl::send()::_lambda()_1_>
                (&local_f8,(Type *)&_b386);
      kj::TaskSet::add(this_01,&local_f8);
      kj::Promise<void>::~Promise(&local_f8);
      _::(anonymous_namespace)::TestVat::ConnectionImpl::OutgoingRpcMessageImpl::send()::
      {lambda()#1}::~send((_lambda___1_ *)&local_110);
      kj::Promise<void>::~Promise((Promise<void> *)&_b386);
      kj::
      Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl,_std::nullptr_t>
      ::~Own((Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl,_std::nullptr_t>
              *)local_28);
      uVar3 = extraout_RAX;
    }
  }
  return uVar3;
}

Assistant:

void send() override {
        KJ_EXPECT(!connection.idle);
        if (!connection.vat.sendCallback(message)) return;

        if (connection.networkException != kj::none) {
          return;
        }

        ++connection.vat.sent;

        // Uncomment to get a debug dump.
//        connection.dumper.dump(message.getRoot<rpc::Message>());

        auto incomingMessage = kj::heap<IncomingRpcMessageImpl>(messageToFlatArray(message));

        kj::Promise<void> blocker = nullptr;
        KJ_IF_SOME(b, connection.currentBlock) {
          blocker = b.addBranch();
        } else {
          blocker = kj::yield();

          // Check if we should start blocking.
          KJ_IF_SOME(p, connection.blockAfterPredicate) {
            if (p(message.getRoot<rpc::Message>())) {
              connection.block();
              connection.blockAfterPredicate = kj::none;
            }
          }
        }